

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  uint uVar1;
  Rtree *in_RSI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  int nCell;
  int rc;
  RtreeNode *pParent;
  int ii;
  RtreeCell cell;
  RtreeCell box;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int iVar2;
  Rtree *pRtree_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  int iVar4;
  RtreeCell local_68;
  RtreeCell local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pRtree_00 = (Rtree *)(in_RSI->base).pModule;
  iVar2 = 0;
  if (pRtree_00 != (Rtree *)0x0) {
    uVar3 = 0xaaaaaaaa;
    uVar1 = readInt16((u8 *)((long)&in_RSI->db->pVfs + 2));
    memcpy(&local_38,&DAT_002b0fd8,0x30);
    nodeGetCell((Rtree *)CONCAT44(uVar3,in_stack_ffffffffffffff90),(RtreeNode *)in_RDI,
                (int)((ulong)in_RSI >> 0x20),(RtreeCell *)pRtree_00);
    for (iVar4 = 1; iVar4 < (int)uVar1; iVar4 = iVar4 + 1) {
      memcpy(&local_68,&DAT_002b1008,0x30);
      nodeGetCell((Rtree *)CONCAT44(iVar4,in_stack_ffffffffffffff90),(RtreeNode *)in_RDI,
                  (int)((ulong)in_RSI >> 0x20),(RtreeCell *)pRtree_00);
      cellUnion(in_RDI,&local_38,&local_68);
    }
    local_38.iRowid = *(i64 *)&(in_RSI->base).nRef;
    iVar2 = nodeParentIndex(pRtree_00,(RtreeNode *)CONCAT44(iVar2,uVar1),
                            (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (iVar2 == 0) {
      nodeOverwriteCell(in_RSI,(RtreeNode *)pRtree_00,(RtreeCell *)(ulong)uVar1,
                        in_stack_ffffffffffffff6c);
      iVar2 = fixBoundingBox(in_RSI,(RtreeNode *)pRtree_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK;
  if( pParent ){
    int ii;
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}